

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O1

void Nwk_ManPrintStats(Nwk_Man_t *pNtk,If_LibLut_t *pLutLib,int fSaveBest,int fDumpResult,int fPower
                      ,Ntl_Man_t *pNtl)

{
  uint uVar1;
  char *__ptr;
  float fVar2;
  char Buffer [1000];
  char acStack_408 [1000];
  
  if (fSaveBest != 0) {
    Nwk_ManCompareAndSaveBest(pNtk,pLutLib);
  }
  if (fDumpResult != 0) {
    memset(acStack_408,0,1000);
    if (pNtk->pSpec == (char *)0x0) {
      __ptr = "nameless_";
    }
    else {
      __ptr = Nwk_FileNameGeneric(pNtk->pSpec);
    }
    sprintf(acStack_408,"%s_dump.blif",__ptr);
    if ((__ptr != (char *)0x0) && (pNtk->pSpec != (char *)0x0)) {
      free(__ptr);
    }
  }
  pNtk->pLutLib = pLutLib;
  printf("%-15s : ",pNtk->pName);
  uVar1 = Nwk_ManPiNum(pNtk);
  printf("pi = %5d  ",(ulong)uVar1);
  uVar1 = Nwk_ManPoNum(pNtk);
  printf("po = %5d  ",(ulong)uVar1);
  printf("ci = %5d  ",(ulong)(uint)pNtk->nObjs[1]);
  printf("co = %5d  ",(ulong)(uint)pNtk->nObjs[2]);
  printf("node = %5d  ",(ulong)(uint)pNtk->nObjs[3]);
  uVar1 = Nwk_ManGetTotalFanins(pNtk);
  printf("edge = %5d  ",(ulong)uVar1);
  uVar1 = Nwk_ManGetAigNodeNum(pNtk);
  printf("aig = %6d  ",(ulong)uVar1);
  uVar1 = Nwk_ManLevel(pNtk);
  printf("lev = %3d  ",(ulong)uVar1);
  fVar2 = Nwk_ManDelayTraceLut(pNtk);
  printf("delay = %5.2f  ",(double)fVar2);
  if (fPower != 0) {
    fVar2 = Nwl_ManComputeTotalSwitching(pNtk);
    printf("power = %7.2f   ",(double)fVar2);
  }
  Nwk_ManPrintLutSizes(pNtk,pLutLib);
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void Nwk_ManPrintStats( Nwk_Man_t * pNtk, If_LibLut_t * pLutLib, int fSaveBest, int fDumpResult, int fPower, Ntl_Man_t * pNtl )
{
//    extern int Ntl_ManLatchNum( Ntl_Man_t * p );
//    extern void Ntl_ManWriteBlifLogic( Nwk_Man_t * pNtk, void * pNtl, char * pFileName );
    if ( fSaveBest )
        Nwk_ManCompareAndSaveBest( pNtk, pNtl );
    if ( fDumpResult )
    {
        char Buffer[1000] = {0};
        const char * pNameGen = pNtk->pSpec? Nwk_FileNameGeneric( pNtk->pSpec ) : "nameless_";
        sprintf( Buffer, "%s_dump.blif", pNameGen );
//        Ntl_ManWriteBlifLogic( pNtk, pNtl, Buffer );
//        sprintf( Buffer, "%s_dump_map.blif", pNameGen );
//        Nwk_ManDumpBlif( pNtk, Buffer, NULL, NULL );
        if ( pNtk->pSpec ) ABC_FREE( pNameGen );
    }

    pNtk->pLutLib = pLutLib;
    printf( "%-15s : ",      pNtk->pName );
    printf( "pi = %5d  ",    Nwk_ManPiNum(pNtk) );
    printf( "po = %5d  ",    Nwk_ManPoNum(pNtk) );
    printf( "ci = %5d  ",    Nwk_ManCiNum(pNtk) );
    printf( "co = %5d  ",    Nwk_ManCoNum(pNtk) );
//    printf( "lat = %5d  ",   Ntl_ManLatchNum(pNtl) );
    printf( "node = %5d  ",  Nwk_ManNodeNum(pNtk) );
    printf( "edge = %5d  ",  Nwk_ManGetTotalFanins(pNtk) );
    printf( "aig = %6d  ",   Nwk_ManGetAigNodeNum(pNtk) );
    printf( "lev = %3d  ",   Nwk_ManLevel(pNtk) );
//    printf( "lev2 = %3d  ",  Nwk_ManLevelBackup(pNtk) );
    printf( "delay = %5.2f  ", Nwk_ManDelayTraceLut(pNtk) );
    if ( fPower )
        printf( "power = %7.2f   ", Nwl_ManComputeTotalSwitching(pNtk) );
    Nwk_ManPrintLutSizes( pNtk, pLutLib );
    printf( "\n" );
//    Nwk_ManDelayTracePrint( pNtk, pLutLib );
    fflush( stdout );
}